

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *nonce_list)

{
  pointer pAVar1;
  bool bVar2;
  char cVar3;
  __type _Var4;
  int iVar5;
  long lVar6;
  undefined7 extraout_var;
  CfdException *pCVar7;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  long lVar8;
  Amount *amount;
  pointer pAVar9;
  long lVar10;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  ulong uVar11;
  allocator local_221;
  ConfidentialTransactionContext *local_220;
  uint32_t local_214;
  Amount total_amount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *local_1e0;
  ConfidentialAssetId asset;
  ConfidentialAssetId fee_asset;
  undefined8 local_178;
  undefined1 local_170;
  ByteData prev_tx;
  undefined8 local_138;
  undefined1 local_130;
  ConfidentialTxOutReference ref;
  
  local_214 = index;
  local_1e0 = nonce_list;
  if (SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
      ::kMinimumAmount == '\0') {
    iVar5 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                                 ::kMinimumAmount);
    if (iVar5 != 0) {
      cfd::core::Amount::Amount
                ((Amount *)
                 &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                  ::kMinimumAmount,100);
      __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                           ::kMinimumAmount);
    }
  }
  pAVar9 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pAVar1 - (long)pAVar9 >> 4;
  lVar6 = (long)(locking_script_list->
                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(locking_script_list->
                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar8 = lVar6 % 0x38;
  if (lVar10 == lVar6 / 0x38) {
    lVar6 = (long)(local_1e0->
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_1e0->
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = lVar6 % 0x28;
    if (lVar10 == lVar6 / 0x28) {
      if (pAVar9 == pAVar1) {
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30,pAVar1,lVar8);
        std::__cxx11::string::string((string *)&ref,"list is empty.",(allocator *)&asset);
        core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&ref);
        __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      bVar2 = HasBlinding(this);
      if (bVar2) {
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&ref,"Already blinded.",(allocator *)&asset);
        core::CfdException::CfdException(pCVar7,kCfdIllegalStateError,(string *)&ref);
        __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&ref);
      cfd::core::Script::Script((Script *)&asset,&ref.super_AbstractTxOutReference.locking_script_);
      cVar3 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)&asset);
      if (cVar3 != '\0') {
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&asset,"Target is fee output.",(allocator *)&fee_asset);
        core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&asset);
        __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,&ref.asset_);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&fee_asset,&ref.confidential_value_);
      local_178 = cfd::core::ConfidentialValue::GetAmount();
      local_170 = extraout_DL;
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&fee_asset);
      cfd::core::Amount::Amount(&total_amount);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset);
      local_138 = GetFeeAmount(this,&fee_asset);
      local_130 = extraout_DL_00;
      cVar3 = cfd::core::operator>((Amount *)&local_138,0);
      if (cVar3 == '\0') {
        local_220 = (ConfidentialTransactionContext *)((ulong)local_220 & 0xffffffff00000000);
      }
      else {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        _Var4 = std::operator==(&local_200,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prev_tx);
        local_220 = (ConfidentialTransactionContext *)
                    CONCAT44(local_220._4_4_,(int)CONCAT71(extraout_var,_Var4));
        std::__cxx11::string::~string((string *)&prev_tx);
        std::__cxx11::string::~string((string *)&local_200);
        _total_amount =
             SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
             ::kMinimumAmount;
      }
      pAVar1 = (amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pAVar9 = (amount_list->
                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                    _M_impl.super__Vector_impl_data._M_start; pAVar9 != pAVar1;
          pAVar9 = pAVar9 + 0x10) {
        cfd::core::Amount::operator+=(&total_amount,pAVar9);
      }
      cVar3 = cfd::core::operator<((Amount *)&local_178,&total_amount);
      if (cVar3 == '\0') {
        if ((char)local_220 != '\0') {
          cfd::core::Amount::operator-=
                    (&total_amount,
                     (Amount *)
                     &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                      ::kMinimumAmount);
        }
        cfd::core::operator-((Amount *)&local_178,&total_amount);
        (**(code **)(*(long *)this + 0x40))(&prev_tx,this);
        local_220 = this;
        cfd::core::ConfidentialTransaction::SetTxOutValue((uint)this,(Amount *)(ulong)local_214);
        lVar8 = 0;
        lVar6 = 0;
        uVar11 = 0;
        while( true ) {
          if ((ulong)((long)(amount_list->
                            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(amount_list->
                            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar11) {
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prev_tx);
            core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
            core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
            core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&ref);
            return;
          }
          cVar3 = cfd::core::Script::IsEmpty();
          if (cVar3 != '\0') break;
          cfd::core::ConfidentialTransaction::AddTxOut
                    ((Amount *)local_220,
                     (ConfidentialAssetId *)
                     ((amount_list->
                      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                      _M_impl.super__Vector_impl_data._M_start + lVar8),(Script *)&asset,
                     (ConfidentialNonce *)
                     ((long)&((locking_script_list->
                              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar6));
          uVar11 = uVar11 + 1;
          lVar6 = lVar6 + 0x38;
          lVar8 = lVar8 + 0x10;
        }
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_200,"Locking script is empty.",&local_221);
        core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_200);
        __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_200,"The Amount is too large.",(allocator *)&prev_tx);
      core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_200);
      __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30,pAVar1,lVar8);
  std::__cxx11::string::string((string *)&ref,"Unmatch each list count.",(allocator *)&asset);
  core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&ref);
  __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list,
    const std::vector<ConfidentialNonce>& nonce_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if ((amount_list.size() != locking_script_list.size()) ||
      (amount_list.size() != nonce_list.size())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch each list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  } else if (HasBlinding()) {
    throw CfdException(CfdError::kCfdIllegalStateError, "Already blinded.");
  }

  auto ref = GetTxOut(index);
  if (ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target is fee output.");
  }

  auto asset = ref.GetAsset();
  auto base_amount = ref.GetConfidentialValue().GetAmount();
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  auto fee = GetFeeAmount(&fee_asset);
  bool has_fee_asset = false;
  if (fee > 0) {
    has_fee_asset = (asset.GetHex() == fee_asset.GetHex());
    total_amount = kMinimumAmount;
  }

  for (const auto& amount : amount_list) total_amount += amount;

  if (base_amount < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  if (has_fee_asset) total_amount -= kMinimumAmount;
  Amount update_amount = base_amount - total_amount;

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(
          amount_list[txout_idx], asset, locking_script_list[txout_idx],
          nonce_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}